

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  int iVar1;
  size_type sVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *in_RDI;
  int n;
  undefined4 in_stack_ffffffffffffffa0;
  
  sVar2 = std::
          vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
          size(in_RDI);
  iVar1 = (int)sVar2;
  do {
    iVar1 = iVar1 + -1;
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    operator[](in_RDI,(long)iVar1);
    UnknownField::Delete((UnknownField *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
  } while (0 < iVar1);
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  clear((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        0x46ccab);
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  GOOGLE_DCHECK(!fields_.empty());
  int n = fields_.size();
  do {
    (fields_)[--n].Delete();
  } while (n > 0);
  fields_.clear();
}